

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *
__thiscall wallet::LegacyDataSPKM::GetScriptPubKeys(LegacyDataSPKM *this)

{
  bool bVar1;
  int iVar2;
  reference ppVar3;
  reference pCVar4;
  long *in_RSI;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *in_RDI;
  long in_FS_OFFSET;
  pair<std::__detail::_Node_iterator<CScript,_true,_true>,_bool> pVar5;
  CScript *script_1;
  WatchOnlySet *__range1_3;
  TxoutType type;
  CScript *script;
  pair<const_CScriptID,_CScript> *script_pair;
  ScriptMap *__range1_2;
  CPubKey *pub_1;
  pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *key_pair_1;
  CryptedKeyMap *__range1_1;
  CPubKey *pub;
  pair<const_CKeyID,_CKey> *key_pair;
  KeyMap *__range1;
  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_> *spks;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  sols;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witprog;
  int wit_ver;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  const_iterator __end1;
  const_iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock49;
  CScript ms_spk;
  CTxDestination *in_stack_fffffffffffffad8;
  map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  *in_stack_fffffffffffffae0;
  undefined7 in_stack_fffffffffffffae8;
  undefined1 in_stack_fffffffffffffaef;
  PKHash *in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf8;
  undefined1 fTry;
  int in_stack_fffffffffffffafc;
  CKey *in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb0c;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffb10;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_fffffffffffffb18;
  TxoutType in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb24;
  _Node_iterator_base<CScript,_true> in_stack_fffffffffffffb28;
  CScript *this_00;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *vSolutionsRet;
  CScript *in_stack_fffffffffffffc08;
  CScript local_390;
  _Base_ptr local_370;
  _Base_ptr local_368;
  _Base_ptr local_360;
  _Base_ptr local_358;
  _Base_ptr local_350;
  _Base_ptr local_348;
  _Node_iterator_base<CScript,_true> local_340;
  undefined1 local_338;
  _Node_iterator_base<CScript,_true> local_330;
  undefined1 local_328;
  _Node_iterator_base<CScript,_true> local_320;
  undefined1 local_318;
  _Node_iterator_base<CScript,_true> local_310;
  undefined1 local_308;
  _Node_iterator_base<CScript,_true> local_300;
  undefined1 local_2f8;
  _Node_iterator_base<CScript,_true> local_2f0;
  undefined1 local_2e8;
  _Node_iterator_base<CScript,_true> local_2e0;
  undefined1 local_2d8;
  _Node_iterator_base<CScript,_true> local_2d0;
  undefined1 local_2c8;
  undefined1 local_248 [511];
  CScript local_49 [2];
  long local_8;
  
  fTry = (undefined1)((uint)in_stack_fffffffffffffaf8 >> 0x18);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffad8);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_fffffffffffffb18,in_stack_fffffffffffffb10,
             (char *)CONCAT44(in_stack_fffffffffffffb0c,in_stack_fffffffffffffb08),
             &in_stack_fffffffffffffb00->fCompressed,in_stack_fffffffffffffafc,(bool)fTry);
  std::unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>::
  unordered_set((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                 *)in_stack_fffffffffffffad8);
  local_348 = (_Base_ptr)
              std::
              map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              ::begin((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                       *)in_stack_fffffffffffffae0);
  local_350 = (_Base_ptr)
              std::
              map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
              ::end((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     *)in_stack_fffffffffffffae0);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffaef,
                                                   in_stack_fffffffffffffae8),
                                 (_Self *)in_stack_fffffffffffffae0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator*
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_fffffffffffffad8)
    ;
    CKey::GetPubKey(in_stack_fffffffffffffb00);
    in_stack_fffffffffffffc08 = local_49;
    GetScriptForRawPubKey((CPubKey *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    pVar5 = std::
            unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
            ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                      *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                     (value_type *)in_stack_fffffffffffffae0);
    local_2d0._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
    local_2c8 = pVar5.second;
    CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
    PKHash::PKHash(in_stack_fffffffffffffaf0,
                   (CPubKey *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (PKHash *)in_stack_fffffffffffffae0);
    GetScriptForDestination(in_stack_fffffffffffffad8);
    pVar5 = std::
            unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
            ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                      *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                     (value_type *)in_stack_fffffffffffffae0);
    local_2e0._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
    local_2d8 = pVar5.second;
    CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffad8);
    std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_CKey>_> *)in_stack_fffffffffffffad8)
    ;
  }
  vSolutionsRet =
       (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        *)(in_RSI + 0x1d);
  local_358 = (_Base_ptr)
              std::
              map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              ::begin((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                       *)in_stack_fffffffffffffae0);
  local_360 = (_Base_ptr)
              std::
              map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
              ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)in_stack_fffffffffffffae0);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffaef,
                                                   in_stack_fffffffffffffae8),
                                 (_Self *)in_stack_fffffffffffffae0), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator*((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 *)in_stack_fffffffffffffad8);
    GetScriptForRawPubKey((CPubKey *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
    pVar5 = std::
            unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
            ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                      *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                     (value_type *)in_stack_fffffffffffffae0);
    local_2f0._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
    local_2e8 = pVar5.second;
    CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
    PKHash::PKHash(in_stack_fffffffffffffaf0,
                   (CPubKey *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
               (PKHash *)in_stack_fffffffffffffae0);
    GetScriptForDestination(in_stack_fffffffffffffad8);
    pVar5 = std::
            unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
            ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                      *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                     (value_type *)in_stack_fffffffffffffae0);
    local_300._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
    local_2f8 = pVar5.second;
    CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant(in_stack_fffffffffffffad8);
    std::
    _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::operator++((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                  *)in_stack_fffffffffffffad8);
  }
  local_368 = (_Base_ptr)
              std::
              map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
              ::begin(in_stack_fffffffffffffae0);
  local_370 = (_Base_ptr)
              std::
              map<CScriptID,_CScript,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
              ::end(in_stack_fffffffffffffae0);
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffaef,
                                                   in_stack_fffffffffffffae8),
                                 (_Self *)in_stack_fffffffffffffae0), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar3 = std::_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>::operator*
                       ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_> *)
                        in_stack_fffffffffffffad8);
    iVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,&ppVar3->second);
    if (iVar2 == 2) {
      bVar1 = CScript::IsPayToScriptHash
                        ((CScript *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
      if (!bVar1) {
        ScriptHash::ScriptHash
                  ((ScriptHash *)in_stack_fffffffffffffaf0,
                   (CScript *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<ScriptHash,void,void,ScriptHash,void>
                  ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                   (ScriptHash *)in_stack_fffffffffffffae0);
        GetScriptForDestination(in_stack_fffffffffffffad8);
        pVar5 = std::
                unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (value_type *)in_stack_fffffffffffffae0);
        local_310._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
        local_308 = pVar5.second;
        CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant(in_stack_fffffffffffffad8);
      }
      local_390.super_CScriptBase._size = 0xffffffff;
      this_00 = &local_390;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffad8)
      ;
      bVar1 = CScript::IsWitnessProgram
                        (this_00,(int *)in_stack_fffffffffffffb28._M_cur,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20));
      if ((bVar1) && (local_390.super_CScriptBase._size == 0)) {
        pVar5 = std::
                unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                          *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                         (value_type *)in_stack_fffffffffffffae0);
        in_stack_fffffffffffffb28._M_cur =
             (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
        local_318 = pVar5.second;
        in_stack_fffffffffffffb24 = CONCAT13(local_318,(int3)in_stack_fffffffffffffb24);
        local_320._M_cur = in_stack_fffffffffffffb28._M_cur;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    }
    else {
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffffad8);
      in_stack_fffffffffffffb20 = Solver(in_stack_fffffffffffffc08,vSolutionsRet);
      if (in_stack_fffffffffffffb20 == MULTISIG) {
        ScriptHash::ScriptHash
                  ((ScriptHash *)in_stack_fffffffffffffaf0,
                   (CScript *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
        std::
        variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
        ::variant<ScriptHash,void,void,ScriptHash,void>
                  ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                    *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                   (ScriptHash *)in_stack_fffffffffffffae0);
        GetScriptForDestination(in_stack_fffffffffffffad8);
        std::
        variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
        ::~variant(in_stack_fffffffffffffad8);
        iVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,local_248);
        if (iVar2 != 0) {
          pVar5 = std::
                  unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                  ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                            *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                           (value_type *)in_stack_fffffffffffffae0);
          local_330._M_cur =
               (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
          local_328 = pVar5.second;
        }
        CScript::~CScript((CScript *)in_stack_fffffffffffffad8);
      }
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8));
    }
    std::_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_CScriptID,_CScript>_> *)
               in_stack_fffffffffffffad8);
  }
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::begin
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)in_stack_fffffffffffffae0
            );
  std::set<CScript,_std::less<CScript>,_std::allocator<CScript>_>::end
            ((set<CScript,_std::less<CScript>,_std::allocator<CScript>_> *)in_stack_fffffffffffffae0
            );
  while (bVar1 = std::operator==((_Self *)CONCAT17(in_stack_fffffffffffffaef,
                                                   in_stack_fffffffffffffae8),
                                 (_Self *)in_stack_fffffffffffffae0), ((bVar1 ^ 0xffU) & 1) != 0) {
    pCVar4 = std::_Rb_tree_const_iterator<CScript>::operator*
                       ((_Rb_tree_const_iterator<CScript> *)in_stack_fffffffffffffad8);
    iVar2 = (**(code **)(*in_RSI + 0x18))(in_RSI,pCVar4);
    if (iVar2 != 0) {
      pVar5 = std::
              unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
              ::insert((unordered_set<CScript,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<CScript>_>
                        *)CONCAT17(in_stack_fffffffffffffaef,in_stack_fffffffffffffae8),
                       (value_type *)in_stack_fffffffffffffae0);
      local_340._M_cur = (__node_type *)pVar5.first.super__Node_iterator_base<CScript,_true>._M_cur;
      in_stack_fffffffffffffaef = pVar5.second;
      local_338 = in_stack_fffffffffffffaef;
    }
    std::_Rb_tree_const_iterator<CScript>::operator++
              ((_Rb_tree_const_iterator<CScript> *)in_stack_fffffffffffffad8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffad8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::unordered_set<CScript, SaltedSipHasher> LegacyDataSPKM::GetScriptPubKeys() const
{
    LOCK(cs_KeyStore);
    std::unordered_set<CScript, SaltedSipHasher> spks;

    // All keys have at least P2PK and P2PKH
    for (const auto& key_pair : mapKeys) {
        const CPubKey& pub = key_pair.second.GetPubKey();
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }
    for (const auto& key_pair : mapCryptedKeys) {
        const CPubKey& pub = key_pair.second.first;
        spks.insert(GetScriptForRawPubKey(pub));
        spks.insert(GetScriptForDestination(PKHash(pub)));
    }

    // For every script in mapScript, only the ISMINE_SPENDABLE ones are being tracked.
    // The watchonly ones will be in setWatchOnly which we deal with later
    // For all keys, if they have segwit scripts, those scripts will end up in mapScripts
    for (const auto& script_pair : mapScripts) {
        const CScript& script = script_pair.second;
        if (IsMine(script) == ISMINE_SPENDABLE) {
            // Add ScriptHash for scripts that are not already P2SH
            if (!script.IsPayToScriptHash()) {
                spks.insert(GetScriptForDestination(ScriptHash(script)));
            }
            // For segwit scripts, we only consider them spendable if we have the segwit spk
            int wit_ver = -1;
            std::vector<unsigned char> witprog;
            if (script.IsWitnessProgram(wit_ver, witprog) && wit_ver == 0) {
                spks.insert(script);
            }
        } else {
            // Multisigs are special. They don't show up as ISMINE_SPENDABLE unless they are in a P2SH
            // So check the P2SH of a multisig to see if we should insert it
            std::vector<std::vector<unsigned char>> sols;
            TxoutType type = Solver(script, sols);
            if (type == TxoutType::MULTISIG) {
                CScript ms_spk = GetScriptForDestination(ScriptHash(script));
                if (IsMine(ms_spk) != ISMINE_NO) {
                    spks.insert(ms_spk);
                }
            }
        }
    }

    // All watchonly scripts are raw
    for (const CScript& script : setWatchOnly) {
        // As the legacy wallet allowed to import any script, we need to verify the validity here.
        // LegacyScriptPubKeyMan::IsMine() return 'ISMINE_NO' for invalid or not watched scripts (IsMineResult::INVALID or IsMineResult::NO).
        // e.g. a "sh(sh(pkh()))" which legacy wallets allowed to import!.
        if (IsMine(script) != ISMINE_NO) spks.insert(script);
    }

    return spks;
}